

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

ShaderInterface * __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::GetShaderInterface
          (ProgramInterface *this,STAGES stage)

{
  TestError *this_00;
  ShaderInterface *local_20;
  ShaderInterface *interface;
  STAGES stage_local;
  ProgramInterface *this_local;
  
  switch(stage) {
  case COMPUTE:
    local_20 = &this->m_compute;
    break;
  case VERTEX:
    local_20 = &this->m_vertex;
    break;
  case TESS_CTRL:
    local_20 = &this->m_tess_ctrl;
    break;
  case TESS_EVAL:
    local_20 = &this->m_tess_eval;
    break;
  case GEOMETRY:
    local_20 = &this->m_geometry;
    break;
  case FRAGMENT:
    local_20 = &this->m_fragment;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x11a1);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_20;
}

Assistant:

const ShaderInterface& ProgramInterface::GetShaderInterface(Shader::STAGES stage) const
{
	const ShaderInterface* interface = 0;

	switch (stage)
	{
	case Shader::COMPUTE:
		interface = &m_compute;
		break;
	case Shader::FRAGMENT:
		interface = &m_fragment;
		break;
	case Shader::GEOMETRY:
		interface = &m_geometry;
		break;
	case Shader::TESS_CTRL:
		interface = &m_tess_ctrl;
		break;
	case Shader::TESS_EVAL:
		interface = &m_tess_eval;
		break;
	case Shader::VERTEX:
		interface = &m_vertex;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return *interface;
}